

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::PrintModelInfo(FlatModelInfo *fmi,char *header,bool aux_vars)

{
  CStringRef arg0;
  CStringRef arg0_00;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  int iVar8;
  byte in_DL;
  long *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *expr_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *expr;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *cone;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range3;
  int i;
  anon_class_1_0_00000001 PrnType;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>
  *val;
  const_iterator __end1;
  const_iterator __begin1;
  ConstrMapByName *__range1;
  anon_class_1_0_00000001 NewName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  cones;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  expr_logic;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  expr_alg;
  int n_sos2;
  int n_sos1;
  int n_indquad;
  int n_indlin;
  int n_condquad;
  int n_condlin;
  int n_cones;
  int n_nl;
  int n_quad;
  int n_lin;
  ConstrMapByName *coninfo;
  ObjInfo oi;
  int nvb;
  int nvi;
  int nv;
  VarInfo vi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e8;
  string *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  int in_stack_fffffffffffff904;
  string *in_stack_fffffffffffff908;
  CStringRef in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  CStringRef in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  uint in_stack_fffffffffffff934;
  reference in_stack_fffffffffffff938;
  anon_class_1_0_00000001 *in_stack_fffffffffffff940;
  undefined7 in_stack_fffffffffffff948;
  byte in_stack_fffffffffffff94f;
  int *in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  int *in_stack_fffffffffffff968;
  char **in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  BasicCStringRef<char> local_568;
  BasicCStringRef<char> local_560;
  reference local_558;
  _Self local_550;
  _Self local_548;
  undefined1 *local_540;
  BasicCStringRef<char> local_538;
  BasicCStringRef<char> local_530;
  reference local_528;
  _Self local_520;
  _Self local_518;
  undefined1 *local_510;
  BasicCStringRef<char> local_508;
  BasicCStringRef<char> local_500;
  BasicCStringRef<char> local_4f8;
  BasicCStringRef<char> local_4f0;
  BasicCStringRef<char> local_4e8;
  string local_4e0 [40];
  BasicCStringRef<char> local_4b8;
  reference local_4b0;
  _Self local_4a8;
  _Self local_4a0;
  undefined1 *local_498;
  int local_48c;
  BasicCStringRef<char> local_488;
  string local_480 [40];
  BasicCStringRef<char> local_458;
  undefined1 local_449 [40];
  allocator<char> local_421;
  string local_420 [39];
  anon_class_1_0_00000001 local_3f9;
  string local_3f8 [39];
  allocator<char> local_3d1;
  string local_3d0 [39];
  allocator<char> local_3a9;
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [39];
  allocator<char> local_359;
  string local_358 [39];
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [32];
  reference local_220;
  _Self local_218;
  _Self local_210;
  undefined8 local_208;
  anon_class_1_0_00000001 local_1f9;
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [48];
  undefined1 local_198 [48];
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  undefined8 local_140;
  BasicCStringRef<char> local_138;
  BasicCStringRef<char> local_130;
  string local_128 [40];
  BasicCStringRef<char> local_100;
  string local_f8 [40];
  BasicCStringRef<char> local_d0;
  string local_c8 [40];
  BasicCStringRef<char> local_a0;
  BasicCStringRef<char> local_98;
  undefined1 local_90 [12];
  undefined1 local_80 [12];
  BasicCStringRef<char> local_68;
  string local_60 [40];
  int local_38;
  int local_34;
  int local_30;
  byte local_11;
  long *local_8;
  
  local_11 = in_DL & 1;
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x20))();
  pvVar4 = std::array<int,_6UL>::operator[]
                     ((array<int,_6UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  iVar8 = *pvVar4;
  uVar3 = (uint)local_11;
  pvVar4 = std::array<int,_6UL>::operator[]
                     ((array<int,_6UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  local_30 = iVar8 + (uVar3 & 1) * *pvVar4;
  pvVar4 = std::array<int,_6UL>::operator[]
                     ((array<int,_6UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  iVar8 = *pvVar4;
  uVar3 = (uint)local_11;
  pvVar4 = std::array<int,_6UL>::operator[]
                     ((array<int,_6UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  local_34 = iVar8 + (uVar3 & 1) * *pvVar4;
  pvVar4 = std::array<int,_6UL>::operator[]
                     ((array<int,_6UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  iVar8 = *pvVar4;
  uVar3 = (uint)local_11;
  pvVar4 = std::array<int,_6UL>::operator[]
                     ((array<int,_6UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  local_38 = iVar8 + (uVar3 & 1) * *pvVar4;
  fmt::BasicCStringRef<char>::BasicCStringRef
            (&local_68,"{} has {} variables ({} integer, {} binary);\n");
  arg0_00.data_._7_1_ = in_stack_fffffffffffff97f;
  arg0_00.data_._0_7_ = in_stack_fffffffffffff978;
  fmt::format<char_const*,int,int,int>
            (arg0_00,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             (int *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
             in_stack_fffffffffffff958);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  fmt::print<>(in_stack_fffffffffffff910);
  std::__cxx11::string::~string(local_60);
  local_90 = (**(code **)(*local_8 + 0x30))();
  local_80 = local_90;
  pvVar5 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  if (*pvVar5 == 0) {
    pvVar5 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)in_stack_fffffffffffff8f0,
                        (size_type)in_stack_fffffffffffff8e8);
    if (*pvVar5 == 0) {
      pvVar5 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)in_stack_fffffffffffff8f0,
                          (size_type)in_stack_fffffffffffff8e8);
      if (*pvVar5 == 0) {
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_98,"No objectives;\n");
        fmt::print<>(in_stack_fffffffffffff910);
        goto LAB_0050c702;
      }
    }
  }
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_a0,"Objectives: ");
  fmt::print<>(in_stack_fffffffffffff910);
  pvVar5 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  if (*pvVar5 != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_d0,"{} linear; ");
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)in_stack_fffffffffffff8f0,(size_type)in_stack_fffffffffffff8e8);
    fmt::format<int>(in_stack_fffffffffffff928,
                     (int *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    fmt::print<>(in_stack_fffffffffffff910);
    std::__cxx11::string::~string(local_c8);
  }
  pvVar5 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  if (*pvVar5 != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_100,"{} quadratic; ");
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)in_stack_fffffffffffff8f0,(size_type)in_stack_fffffffffffff8e8);
    fmt::format<int>(in_stack_fffffffffffff928,
                     (int *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    fmt::print<>(in_stack_fffffffffffff910);
    std::__cxx11::string::~string(local_f8);
  }
  pvVar5 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)in_stack_fffffffffffff8f0,
                      (size_type)in_stack_fffffffffffff8e8);
  if (*pvVar5 != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_130,"{} nonlinear; ");
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)in_stack_fffffffffffff8f0,(size_type)in_stack_fffffffffffff8e8);
    fmt::format<int>(in_stack_fffffffffffff928,
                     (int *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    fmt::print<>(in_stack_fffffffffffff910);
    std::__cxx11::string::~string(local_128);
  }
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_138,"\n");
  fmt::print<>(in_stack_fffffffffffff910);
LAB_0050c702:
  local_140 = (**(code **)(*local_8 + 0x50))();
  local_144 = 0;
  local_148 = 0;
  local_14c = 0;
  local_150 = 0;
  local_154 = 0;
  local_158 = 0;
  local_15c = 0;
  local_160 = 0;
  local_164 = 0;
  local_168 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x50c793);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x50c7a0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x50c7ad);
  local_208 = local_140;
  local_210._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
                *)in_stack_fffffffffffff8e8);
  local_218._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
              *)in_stack_fffffffffffff8e8);
  while( true ) {
    bVar1 = std::operator!=(&local_210,&local_218);
    if (!bVar1) break;
    local_220 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>
                ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>
                             *)in_stack_fffffffffffff8f0);
    if ((local_220->second).n_ != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 in_stack_fffffffffffff928.data_,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
      bVar1 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator(&local_241);
      if (bVar1) {
        local_144 = (local_220->second).n_ + local_144;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   in_stack_fffffffffffff928.data_,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920))
        ;
        bVar1 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator(&local_269);
        if (bVar1) {
          local_148 = (local_220->second).n_ + local_148;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     in_stack_fffffffffffff928.data_,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          bVar1 = ends_with(in_stack_fffffffffffff908,
                            (string *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900))
          ;
          std::__cxx11::string::~string(local_290);
          std::allocator<char>::~allocator(&local_291);
          if (bVar1) {
            local_150 = local_150 + (local_220->second).n_;
            iVar8 = (local_220->second).n_;
            PrintModelInfo::anon_class_1_0_00000001::operator()
                      (&local_1f9,(local_220->second).name_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       in_stack_fffffffffffff928.data_,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                  (key_type *)in_stack_fffffffffffff928.data_);
            *pmVar6 = iVar8;
            std::__cxx11::string::~string(local_2b8);
            std::allocator<char>::~allocator(&local_2b9);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       in_stack_fffffffffffff928.data_,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
            bVar1 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
            std::__cxx11::string::~string(local_2e0);
            std::allocator<char>::~allocator(&local_2e1);
            if (bVar1) {
              local_154 = (local_220->second).n_ + local_154;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                         in_stack_fffffffffffff928.data_,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
              bVar1 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
              std::__cxx11::string::~string(local_308);
              std::allocator<char>::~allocator(&local_309);
              if (bVar1) {
                local_158 = (local_220->second).n_ + local_158;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                           in_stack_fffffffffffff928.data_,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
                bVar1 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
                std::__cxx11::string::~string(local_330);
                std::allocator<char>::~allocator(&local_331);
                if (bVar1) {
                  bVar1 = std::operator==(in_stack_fffffffffffff8f0,
                                          (char *)in_stack_fffffffffffff8e8);
                  if (bVar1) {
                    local_14c = (local_220->second).n_ + local_14c;
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             in_stack_fffffffffffff928.data_,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
                  bVar1 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
                  std::__cxx11::string::~string(local_358);
                  std::allocator<char>::~allocator(&local_359);
                  if (bVar1) {
                    local_164 = (local_220->second).n_ + local_164;
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               in_stack_fffffffffffff928.data_,
                               (allocator<char> *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
                    bVar2 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
                    std::__cxx11::string::~string(local_380);
                    std::allocator<char>::~allocator(&local_381);
                    if ((bVar2 & 1) == 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 in_stack_fffffffffffff928.data_,
                                 (allocator<char> *)
                                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
                      bVar2 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
                      std::__cxx11::string::~string(local_3a8);
                      std::allocator<char>::~allocator(&local_3a9);
                      if ((bVar2 & 1) == 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                   in_stack_fffffffffffff928.data_,
                                   (allocator<char> *)
                                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
                        in_stack_fffffffffffff94f =
                             begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
                        std::__cxx11::string::~string(local_3d0);
                        std::allocator<char>::~allocator(&local_3d1);
                        if ((in_stack_fffffffffffff94f & 1) == 0) {
                          in_stack_fffffffffffff940 = &local_3f9;
                          in_stack_fffffffffffff938 = local_220;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930
                                                ),in_stack_fffffffffffff928.data_,
                                     (allocator<char> *)
                                     CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
                          bVar1 = begins_with(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
                          in_stack_fffffffffffff934 =
                               CONCAT13(bVar1,(int3)in_stack_fffffffffffff934);
                          std::__cxx11::string::~string(local_3f8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
                          if ((in_stack_fffffffffffff934 & 0x1000000) == 0) {
                            if (((local_220->second).is_logical_ & 1U) == 0) {
                              in_stack_fffffffffffff904 = (local_220->second).n_;
                              in_stack_fffffffffffff908 =
                                   (string *)
                                   PrintModelInfo::anon_class_1_0_00000001::operator()
                                             (&local_1f9,(local_220->second).name_);
                              in_stack_fffffffffffff8f8 = (string *)local_449;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff934,
                                                     in_stack_fffffffffffff930),
                                         in_stack_fffffffffffff928.data_,
                                         (allocator<char> *)
                                         CONCAT44(in_stack_fffffffffffff924,
                                                  in_stack_fffffffffffff920));
                              in_stack_fffffffffffff8f0 =
                                   (string *)
                                   std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                 *)CONCAT44(in_stack_fffffffffffff934,
                                                            in_stack_fffffffffffff930),
                                                (key_type *)in_stack_fffffffffffff928.data_);
                              *(int *)in_stack_fffffffffffff8f0 = in_stack_fffffffffffff904;
                              std::__cxx11::string::~string((string *)(local_449 + 1));
                              std::allocator<char>::~allocator((allocator<char> *)local_449);
                            }
                            else {
                              in_stack_fffffffffffff924 = (local_220->second).n_;
                              in_stack_fffffffffffff928.data_ =
                                   PrintModelInfo::anon_class_1_0_00000001::operator()
                                             (&local_1f9,(local_220->second).name_);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff934,
                                                     in_stack_fffffffffffff930),
                                         in_stack_fffffffffffff928.data_,
                                         (allocator<char> *)
                                         CONCAT44(in_stack_fffffffffffff924,
                                                  in_stack_fffffffffffff920));
                              in_stack_fffffffffffff910.data_ =
                                   (char *)std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                           ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff934,
                                                             in_stack_fffffffffffff930),
                                                  in_stack_fffffffffffff928.data_);
                              *(int *)in_stack_fffffffffffff910.data_ = in_stack_fffffffffffff924;
                              std::__cxx11::string::~string(local_420);
                              std::allocator<char>::~allocator(&local_421);
                            }
                          }
                        }
                        else {
                          local_160 = (local_220->second).n_ + local_160;
                        }
                      }
                      else {
                        local_15c = (local_220->second).n_ + local_15c;
                      }
                    }
                    else {
                      local_168 = (local_220->second).n_ + local_168;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>
                  *)in_stack_fffffffffffff8f0);
  }
  if (local_144 + local_148 + local_14c + local_150 + local_164 + local_168 != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_458,"Constraints: ");
    fmt::print<>(in_stack_fffffffffffff910);
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    if (local_150 != 0) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_488," {} conic (");
      fmt::format<int>(in_stack_fffffffffffff928,
                       (int *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      fmt::print<>(in_stack_fffffffffffff910);
      std::__cxx11::string::~string(local_480);
      local_48c = 0;
      local_498 = local_1f8;
      local_4a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffff8e8);
      local_4a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffff8e8);
      while( true ) {
        bVar1 = std::operator!=(&local_4a0,&local_4a8);
        if (!bVar1) break;
        local_4b0 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                 *)0x50d701);
        iVar8 = local_48c + 1;
        bVar1 = local_48c != 0;
        local_48c = iVar8;
        if (bVar1) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_4b8," ");
          fmt::print<>(in_stack_fffffffffffff910);
        }
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_4e8,"{} {}");
        arg0.data_._7_1_ = in_stack_fffffffffffff94f;
        arg0.data_._0_7_ = in_stack_fffffffffffff948;
        fmt::format<int,std::__cxx11::string>
                  (arg0,(int *)in_stack_fffffffffffff940,&in_stack_fffffffffffff938->first);
        fmt::BasicCStringRef<char>::BasicCStringRef
                  ((BasicCStringRef<char> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        fmt::print<>(in_stack_fffffffffffff910);
        std::__cxx11::string::~string(local_4e0);
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)0x50d7ea);
        if ((int)sVar7 != local_48c) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_4f0,",");
          fmt::print<>(in_stack_fffffffffffff910);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      *)in_stack_fffffffffffff8f0);
      }
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_4f8,");");
      fmt::print<>(in_stack_fffffffffffff910);
    }
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_500,"\n");
    fmt::print<>(in_stack_fffffffffffff910);
  }
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)0x50d8e9);
  if (sVar7 != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_508,"Algebraic expressions: ");
    fmt::print<>(in_stack_fffffffffffff910);
    local_510 = local_198;
    local_518._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffff8e8);
    local_520._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)in_stack_fffffffffffff8e8);
    while( true ) {
      bVar1 = std::operator!=(&local_518,&local_520);
      if (!bVar1) break;
      local_528 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                               *)0x50d97a);
      std::__cxx11::string::c_str();
      PrintModelInfo::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,
                 in_stack_fffffffffffff934);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    *)in_stack_fffffffffffff8f0);
    }
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_530,"\n");
    fmt::print<>(in_stack_fffffffffffff910);
  }
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)0x50d9f1);
  if ((((sVar7 != 0) || (local_154 != 0)) || (local_158 != 0)) ||
     ((local_15c != 0 || (local_160 != 0)))) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_538,"Logical expressions: ");
    fmt::print<>(in_stack_fffffffffffff910);
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    PrintModelInfo::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,in_stack_fffffffffffff934
              );
    local_540 = local_1c8;
    local_548._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffff8e8);
    local_550._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)in_stack_fffffffffffff8e8);
    while( true ) {
      bVar1 = std::operator!=(&local_548,&local_550);
      if (!bVar1) break;
      local_558 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                               *)0x50db1e);
      std::__cxx11::string::c_str();
      PrintModelInfo::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,
                 in_stack_fffffffffffff934);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    *)in_stack_fffffffffffff8f0);
    }
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_560,"\n");
    fmt::print<>(in_stack_fffffffffffff910);
  }
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_568,"\n");
  fmt::print<>(in_stack_fffffffffffff910);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x50dbba);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x50dbc7);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x50dbd4);
  return;
}

Assistant:

void PrintModelInfo(const FlatModelInfo& fmi,
    const char* header, bool aux_vars) {
  auto vi = fmi.GetVarInfo();
  int nv = vi[0] + aux_vars*vi[3];
  int nvi = vi[1] + aux_vars*vi[4];
  int nvb = vi[2] + aux_vars*vi[5];
  fmt::print(fmt::format(
      "{} has {} variables ({} integer, {} binary);\n",
      header, nv, nvi, nvb));
  auto oi = fmi.GetObjInfo();
  if (true || 1!=oi[0] || oi[1] || oi[2]) {
    if (!oi[0] && !oi[1] && !oi[2])
      fmt::print("No objectives;\n");
    else {
      fmt::print("Objectives: ");
      if (oi[0])
        fmt::print(fmt::format("{} linear; ", oi[0]));
      if (oi[1])
        fmt::print(fmt::format("{} quadratic; ", oi[1]));
      if (oi[2])
        fmt::print(fmt::format("{} nonlinear; ", oi[2]));
      fmt::print("\n");
    }
  }
  const auto& coninfo = fmi.GetConstraintTypes();
  int n_lin = 0;
  int n_quad = 0;
  int n_nl = 0;
  int n_cones = 0;
  int n_condlin = 0, n_condquad = 0;
  int n_indlin = 0, n_indquad = 0;
  int n_sos1 = 0, n_sos2 = 0;
  std::map<std::string, int> expr_alg, expr_logic, cones;
  auto NewName = [](const char* old) { return old+1; };  // skip _
  for (const auto& val: coninfo) {
    if (val.second.n_) {
      if (begins_with(val.first, "_lin"))
        n_lin += val.second.n_;
      else if (begins_with(val.first, "_quad"))
        n_quad += val.second.n_;
      else if (ends_with(val.first, "cone")) {
        n_cones += val.second.n_;
        cones[NewName(val.second.name_)] = val.second.n_;
      }
      else if (begins_with(val.first, "_condlin"))
        n_condlin += val.second.n_;
      else if (begins_with(val.first, "_condquad"))
        n_condquad += val.second.n_;
      else if (begins_with(val.first, "_nl")) {
        if (val.first == "_nlcon")
          n_nl += val.second.n_;
      }  // else, NL assignment or logical - skip
      else if (begins_with(val.first, "_sos1"))
        n_sos1 += val.second.n_;
      else if (begins_with(val.first, "_sos2"))
        n_sos2 += val.second.n_;
      else if (begins_with(val.first, "_indlin"))
        n_indlin += val.second.n_;
      else if (begins_with(val.first, "_indquad"))
        n_indquad += val.second.n_;
      else if (begins_with(val.first, "_uenc"))
      { }
      // Else, it's expressions
      else if (val.second.is_logical_)
        expr_logic[NewName(val.second.name_)] = val.second.n_;
      else
        expr_alg[NewName(val.second.name_)] = val.second.n_;
    }
  }
  auto PrnType = [](const char* descr, int n) {
    if (n)
      fmt::print(fmt::format(" {} {};", n, descr));
  };
  if (n_lin + n_quad + n_nl + n_cones + n_sos1 + n_sos2) {
    fmt::print("Constraints: ");
    PrnType("linear", n_lin);
    PrnType("quadratic", n_quad);
    PrnType("nonlinear", n_nl);
    if (n_cones) {
      fmt::print(fmt::format(" {} conic (", n_cones));
      int i=0;
      for (const auto& cone: cones) {
        if (i++)
          fmt::print(" ");
        fmt::print(fmt::format("{} {}", cone.second, cone.first));
        if (int(cones.size())!=i)
          fmt::print(",");
      }
      fmt::print(");");
    }
    PrnType("SOS1", n_sos1);
    PrnType("SOS2", n_sos2);
    fmt::print("\n");
  }
  if (expr_alg.size()) {
    fmt::print("Algebraic expressions: ");
    for (const auto& expr: expr_alg)
      PrnType(expr.first.c_str(), expr.second);
    fmt::print("\n");
  }
  if (expr_logic.size()
      || n_condlin || n_condquad
      || n_indlin || n_indquad) {
    fmt::print("Logical expressions: ");
    PrnType("indicator(s)", n_indlin);
    PrnType("quadratic indicator(s)", n_indquad);
    PrnType("conditional (in)equalitie(s)", n_condlin);
    PrnType("conditional quadratic (in)equalitie(s)", n_condquad);
    for (const auto& expr: expr_logic)
      PrnType(expr.first.c_str(), expr.second);
    fmt::print("\n");
  }
  fmt::print("\n");
}